

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  SnapGeneratorVirtualScriptFunctionInfo *pSVar1;
  FunctionBody *proxy;
  JavascriptLibrary *this_00;
  GeneratorVirtualScriptFunction *pGVar2;
  FunctionBody *fbody;
  SnapGeneratorVirtualScriptFunctionInfo *sgvsf;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorVirtualScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)35>
                     (snpObject);
  proxy = InflateMap::LookupFunctionBody(inflator,(pSVar1->super_SnapScriptFunctionInfo).BodyRefId);
  this_00 = Js::ScriptContext::GetLibrary(this);
  pGVar2 = Js::JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                     (this_00,(FunctionProxy *)proxy);
  return (RecyclableObject *)pGVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo(const SnapObject *snpObject, InflateMap *inflator)
        {
            Js::ScriptContext *ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapGeneratorVirtualScriptFunctionInfo* sgvsf = SnapObjectGetAddtlInfoAs<SnapGeneratorVirtualScriptFunctionInfo *, SnapObjectType::SnapGeneratorVirtualScriptFunction>(snpObject);
            Js::FunctionBody* fbody = inflator->LookupFunctionBody(sgvsf->BodyRefId);
            return ctx->GetLibrary()->CreateGeneratorVirtualScriptFunction(fbody);
        }